

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QList<QRect> * __thiscall QList<QRect>::fill(QList<QRect> *this,parameter_type t,qsizetype newSize)

{
  undefined8 *puVar1;
  Data *pDVar2;
  QRect *pQVar3;
  undefined8 uVar4;
  QRect QVar5;
  qsizetype qVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QRect> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc < newSize)) {
    qVar6 = QArrayDataPointer<QRect>::detachCapacity(&this->d,newSize);
    local_48._0_16_ = QTypedArrayData<QRect>::allocate(qVar6,KeepSize);
    local_48.size = 0;
    QtPrivate::QGenericArrayOps<QRect>::copyAppend((QGenericArrayOps<QRect> *)&local_48,newSize,t);
    QVar5 = *(QRect *)&this->d;
    (this->d).d = local_48.d;
    (this->d).ptr = local_48.ptr;
    qVar6 = (this->d).size;
    (this->d).size = local_48.size;
    local_48._0_16_ = QVar5;
    local_48.size = qVar6;
    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_48);
  }
  else {
    local_48._0_16_ = *t;
    pQVar3 = (this->d).ptr;
    lVar7 = (this->d).size;
    if (newSize <= lVar7) {
      lVar7 = newSize;
    }
    for (lVar8 = 0; lVar7 * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
      puVar1 = (undefined8 *)((long)&(pQVar3->x1).m_i + lVar8);
      uVar4 = *(undefined8 *)&t->x2;
      *puVar1 = *(undefined8 *)t;
      puVar1[1] = uVar4;
    }
    lVar7 = (this->d).size;
    if (newSize - lVar7 == 0 || newSize < lVar7) {
      if (newSize < lVar7) {
        (this->d).size = newSize;
      }
    }
    else {
      QtPrivate::QGenericArrayOps<QRect>::copyAppend
                ((QGenericArrayOps<QRect> *)this,newSize - lVar7,(parameter_type)&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}